

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_gears.c
# Opt level: O0

void draw_gear(gears_t_conflict1 *gears,int id,float model_tx,float model_ty,float model_rz,
              float *color)

{
  gear_conflict *pgVar1;
  int iVar2;
  char *pcVar3;
  int local_e0;
  int k;
  GLint TextureEnable_loc;
  GLint Color_loc;
  GLint Normal_loc;
  GLint ModelViewProjection_loc;
  GLint LightPos_loc;
  float ModelViewProjection [16];
  float ModelView [16];
  float pos [4];
  gear_conflict *gear;
  float *color_local;
  float model_rz_local;
  float model_ty_local;
  float model_tx_local;
  int id_local;
  gears_t_conflict1 *gears_local;
  
  pgVar1 = gears->gear[id];
  ModelView[0xe] = 5.0;
  ModelView[0xf] = 5.0;
  if (pgVar1 != (gear_conflict *)0x0) {
    iVar2 = (*gears->glGetUniformLocation)(gears->program,"u_LightPos");
    (*gears->glUniform4fv)(iVar2,1,ModelView + 0xe);
    memcpy(ModelViewProjection + 0xe,gears->View,0x40);
    translate(ModelViewProjection + 0xe,model_tx,model_ty,0.0);
    rotate(ModelViewProjection + 0xe,model_rz,0.0,0.0,1.0);
    memcpy(&ModelViewProjection_loc,gears->Projection,0x40);
    multiply((float *)&ModelViewProjection_loc,ModelViewProjection + 0xe);
    iVar2 = (*gears->glGetUniformLocation)(gears->program,"u_ModelViewProjectionMatrix");
    (*gears->glUniformMatrix4fv)(iVar2,1,'\0',(GLfloat *)&ModelViewProjection_loc);
    invert(ModelViewProjection + 0xe);
    transpose(ModelViewProjection + 0xe);
    iVar2 = (*gears->glGetUniformLocation)(gears->program,"u_NormalMatrix");
    (*gears->glUniformMatrix4fv)(iVar2,1,'\0',ModelViewProjection + 0xe);
    iVar2 = (*gears->glGetUniformLocation)(gears->program,"u_Color");
    (*gears->glUniform4fv)(iVar2,1,color);
    iVar2 = (*gears->glGetUniformLocation)(gears->program,"u_TextureEnable");
    pcVar3 = getenv("NO_TEXTURE");
    if (pcVar3 == (char *)0x0) {
      (*gears->glUniform1i)(iVar2,1);
    }
    else {
      (*gears->glUniform1i)(iVar2,0);
    }
    (*gears->glBindBuffer)(0x8892,pgVar1->vbo);
    (*gears->glVertexAttribPointer)(0,3,0x1406,'\0',0x20,(GLvoid *)0x0);
    (*gears->glVertexAttribPointer)(1,3,0x1406,'\0',0x20,(GLvoid *)0xc);
    (*gears->glVertexAttribPointer)(2,2,0x1406,'\0',0x20,(GLvoid *)0x18);
    (*gears->glEnableVertexAttribArray)(0);
    (*gears->glEnableVertexAttribArray)(1);
    (*gears->glEnableVertexAttribArray)(2);
    for (local_e0 = 0; local_e0 < pgVar1->nstrips; local_e0 = local_e0 + 1) {
      (*gears->glDrawArrays)(5,pgVar1->strips[local_e0].begin,pgVar1->strips[local_e0].count);
    }
    (*gears->glDisableVertexAttribArray)(2);
    (*gears->glDisableVertexAttribArray)(1);
    (*gears->glDisableVertexAttribArray)(0);
  }
  return;
}

Assistant:

static void draw_gear(gears_t *gears, int id, float model_tx, float model_ty, float model_rz, const float *color)
{
  struct gear *gear = gears->gear[id];
  const float pos[4] = { 5.0, 5.0, 10.0, 0.0 };

  if (!gear) {
    return;
  }

  glPushMatrix();
  glLoadIdentity();
  glLightfv(GL_LIGHT0, GL_POSITION, pos);
  glPopMatrix();

  glPushMatrix();

  glTranslatef(model_tx, model_ty, 0);
  glRotatef(model_rz, 0, 0, 1);

  glMaterialfv(GL_FRONT_AND_BACK, GL_AMBIENT_AND_DIFFUSE, color);

  if (getenv("NO_TEXTURE"))
    glDisable(GL_TEXTURE_2D);
  else
    glEnable(GL_TEXTURE_2D);

  glCallList(gear->list);

  glPopMatrix();
}